

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int userauth_publickey_frommemory
              (LIBSSH2_SESSION *session,char *username,size_t username_len,char *publickeydata,
              size_t publickeydata_len,char *privatekeydata,size_t privatekeydata_len,
              char *passphrase)

{
  int iVar1;
  void **ppvStack_68;
  int rc;
  void *abstract;
  privkey_file privkey_file;
  size_t pubkeydata_len;
  uchar *pubkeydata;
  char *privatekeydata_local;
  size_t publickeydata_len_local;
  char *publickeydata_local;
  size_t username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  pubkeydata_len = 0;
  privkey_file.passphrase = (char *)0x0;
  ppvStack_68 = &abstract;
  privkey_file.filename = passphrase;
  abstract = privatekeydata;
  pubkeydata = (uchar *)privatekeydata;
  privatekeydata_local = (char *)publickeydata_len;
  publickeydata_len_local = (size_t)publickeydata;
  publickeydata_local = (char *)username_len;
  username_len_local = (size_t)username;
  username_local = (char *)session;
  if (session->userauth_pblc_state == libssh2_NB_state_idle) {
    if ((publickeydata_len == 0) || (publickeydata == (char *)0x0)) {
      if ((privatekeydata_len == 0) || (privatekeydata == (char *)0x0)) {
        iVar1 = _libssh2_error(session,-0x10,"Invalid data in public and private key.");
        return iVar1;
      }
      iVar1 = _libssh2_pub_priv_keyfilememory
                        (session,&session->userauth_pblc_method,&session->userauth_pblc_method_len,
                         (uchar **)&pubkeydata_len,(size_t *)&privkey_file.passphrase,privatekeydata
                         ,privatekeydata_len,passphrase);
    }
    else {
      iVar1 = memory_read_publickey
                        (session,&session->userauth_pblc_method,&session->userauth_pblc_method_len,
                         (uchar **)&pubkeydata_len,(size_t *)&privkey_file.passphrase,publickeydata,
                         publickeydata_len);
    }
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = _libssh2_userauth_publickey
                    ((LIBSSH2_SESSION *)username_local,(char *)username_len_local,
                     (uint)publickeydata_local,(uchar *)pubkeydata_len,
                     (unsigned_long)privkey_file.passphrase,sign_frommemory,&stack0xffffffffffffff98
                    );
  if (pubkeydata_len != 0) {
    (**(code **)(username_local + 0x18))(pubkeydata_len,username_local);
  }
  return iVar1;
}

Assistant:

static int
userauth_publickey_frommemory(LIBSSH2_SESSION *session,
                              const char *username,
                              size_t username_len,
                              const char *publickeydata,
                              size_t publickeydata_len,
                              const char *privatekeydata,
                              size_t privatekeydata_len,
                              const char *passphrase)
{
    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;
    struct privkey_file privkey_file;
    void *abstract = &privkey_file;
    int rc;

    privkey_file.filename = privatekeydata;
    privkey_file.passphrase = passphrase;

    if(session->userauth_pblc_state == libssh2_NB_state_idle) {
        if(publickeydata_len && publickeydata) {
            rc = memory_read_publickey(session, &session->userauth_pblc_method,
                                       &session->userauth_pblc_method_len,
                                       &pubkeydata, &pubkeydata_len,
                                       publickeydata, publickeydata_len);
            if(rc)
                return rc;
        }
        else if(privatekeydata_len && privatekeydata) {
            /* Compute public key from private key. */
            rc = _libssh2_pub_priv_keyfilememory(session,
                                            &session->userauth_pblc_method,
                                            &session->userauth_pblc_method_len,
                                            &pubkeydata, &pubkeydata_len,
                                            privatekeydata, privatekeydata_len,
                                            passphrase);
            if(rc)
                return rc;
        }
        else {
            return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                                  "Invalid data in public and private key.");
        }
    }

    rc = _libssh2_userauth_publickey(session, username, username_len,
                                     pubkeydata, pubkeydata_len,
                                     sign_frommemory, &abstract);
    if(pubkeydata)
        LIBSSH2_FREE(session, pubkeydata);

    return rc;
}